

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
kj::
newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
          (PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
           *__return_storage_ptr__,SourceLocation location)

{
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar1;
  void *pvVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_20;
  
  pPVar1 = (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
            *)operator_new(0x18);
  pPVar1[2].super_PromiseRejector._vptr_PromiseRejector = (_func_int **)0x0;
  (pPVar1->super_PromiseRejector)._vptr_PromiseRejector = (_func_int **)&PTR_reject_0066f158;
  pPVar1[1].super_PromiseRejector._vptr_PromiseRejector = (_func_int **)&PTR_disposeImpl_0066f190;
  local_30.disposer = (Disposer *)(pPVar1 + 1);
  pvVar2 = operator_new(0x400);
  *(undefined8 *)((long)pvVar2 + 0x230) = 0;
  *(undefined ***)((long)pvVar2 + 0x220) = &PTR_destroy_0066f208;
  *(undefined ***)((long)pvVar2 + 0x238) = &PTR_reject_0066f258;
  *(undefined1 *)((long)pvVar2 + 0x240) = 0;
  *(undefined1 *)((long)pvVar2 + 0x3d8) = 0;
  *(undefined1 *)((long)pvVar2 + 1000) = 1;
  *(_func_int ***)((long)pvVar2 + 0x3f0) = (_func_int **)((long)pvVar2 + 0x238);
  *(PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> **
   )((long)pvVar2 + 0x3f8) = pPVar1;
  local_38.ptr = (PromiseNode *)0x0;
  pPVar1[2].super_PromiseRejector._vptr_PromiseRejector = (_func_int **)((long)pvVar2 + 0x238);
  *(void **)((long)pvVar2 + 0x228) = pvVar2;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr =
       (PromiseNode *)((long)pvVar2 + 0x220);
  local_20.ptr = (PromiseNode *)0x0;
  (__return_storage_ptr__->fulfiller).disposer = (Disposer *)(pPVar1 + 1);
  (__return_storage_ptr__->fulfiller).ptr = pPVar1;
  local_30.ptr = (WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                  *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_20);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  ::~Own(&local_30);
  return __return_storage_ptr__;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller(SourceLocation location) {
  auto wrapper = _::WeakFulfiller<T>::make();

  _::OwnPromiseNode intermediate(
      _::allocPromise<_::AdapterPromiseNode<
          _::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  auto promise = _::PromiseNode::to<_::ReducePromises<T>>(
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr), location));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}